

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O1

void * lzham::task_pool::thread_func(void *pContext)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  code *pcVar6;
  undefined8 uVar7;
  undefined8 local_40;
  
  local_40 = 0;
  pcVar6 = (code *)0x0;
  uVar7 = 0;
  uVar5 = 0;
  do {
    iVar1 = sem_wait((sem_t *)((long)pContext + 0x298));
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x6e) {
        lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                   ,0x52);
      }
      if (iVar1 != 0) {
        return (void *)0x0;
      }
    }
    if (*(long *)((long)pContext + 0x2c0) != 0) {
      return (void *)0x0;
    }
    iVar1 = pthread_spin_lock((pthread_spinlock_t *)pContext);
    if (iVar1 != 0) {
      lzham_fail("\"spinlock: pthread_spin_lock() failed\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                 ,0x72);
    }
    iVar1 = *(int *)((long)pContext + 0x208);
    if (0 < iVar1) {
      *(uint *)((long)pContext + 0x208) = iVar1 - 1U;
      lVar4 = (ulong)(iVar1 - 1U) * 0x20;
      uVar7 = *(undefined8 *)((long)pContext + lVar4 + 8);
      local_40 = *(undefined8 *)((long)pContext + lVar4 + 0x10);
      pcVar6 = *(code **)((long)pContext + lVar4 + 0x18);
      uVar5 = *(uint *)((long)pContext + lVar4 + 0x20);
    }
    iVar2 = pthread_spin_unlock((pthread_spinlock_t *)pContext);
    if (iVar2 != 0) {
      lzham_fail("\"spinlock: pthread_spin_unlock() failed\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                 ,0x7a);
    }
    if (0 < iVar1) {
      if ((uVar5 & 1) == 0) {
        (*pcVar6)(uVar7,local_40);
      }
      else {
        (*(code *)**(undefined8 **)pcVar6)(pcVar6,uVar7,local_40);
      }
      LOCK();
      *(long *)((long)pContext + 0x2b8) = *(long *)((long)pContext + 0x2b8) + -1;
      UNLOCK();
    }
  } while( true );
}

Assistant:

void * task_pool::thread_func(void *pContext)
   {
      task_pool* pPool = static_cast<task_pool*>(pContext);
      task tsk;

      for ( ; ; )
      {
         if (!pPool->m_tasks_available.wait())
            break;

         if (pPool->m_exit_flag)
            break;

         if (pPool->m_task_stack.pop(tsk))
         {
            pPool->process_task(tsk);
         }
      }

      return NULL;
   }